

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void MapOptHandler_cluster(FMapInfoParser *parse,level_info_t *info)

{
  int iVar1;
  uint uVar2;
  cluster_info_t *this;
  cluster_info_t *clusterinfo;
  uint clusterindex;
  level_info_t *info_local;
  FMapInfoParser *parse_local;
  
  FMapInfoParser::ParseAssign(parse);
  FScanner::MustGetNumber(&parse->sc);
  info->cluster = (parse->sc).Number;
  iVar1 = FindWadClusterInfo((parse->sc).Number);
  if (iVar1 == -1) {
    uVar2 = TArray<cluster_info_t,_cluster_info_t>::Reserve(&wadclusterinfos,1);
    this = TArray<cluster_info_t,_cluster_info_t>::operator[](&wadclusterinfos,(ulong)uVar2);
    cluster_info_t::Reset(this);
    this->cluster = (parse->sc).Number;
    if ((parse->HexenHack & 1U) != 0) {
      this->flags = this->flags | 1;
    }
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(cluster, true)
{
	parse.ParseAssign();
	parse.sc.MustGetNumber();
	info->cluster = parse.sc.Number;

	// If this cluster hasn't been defined yet, add it. This is especially needed
	// for Hexen, because it doesn't have clusterdefs. If we don't do this, every
	// level on Hexen will sometimes be considered as being on the same hub,
	// depending on the check done.
	if (FindWadClusterInfo (parse.sc.Number) == -1)
	{
		unsigned int clusterindex = wadclusterinfos.Reserve(1);
		cluster_info_t *clusterinfo = &wadclusterinfos[clusterindex];
		clusterinfo->Reset();
		clusterinfo->cluster = parse.sc.Number;
		if (parse.HexenHack)
		{
			clusterinfo->flags |= CLUSTER_HUB;
		}
	}
}